

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int kinLsPSolve(void *kinmem,N_Vector r,N_Vector z,realtype tol,int lr)

{
  int iVar1;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINLsMem local_20;
  KINMem local_18;
  
  iVar1 = kinLs_AccessLMem(kinmem,"kinLsPSolve",&local_18,&local_20);
  if (iVar1 == 0) {
    N_VScale(1.0,r,z);
    iVar1 = (*local_20->psolve)(local_18->kin_uu,local_18->kin_uscale,local_18->kin_fval,
                                local_18->kin_fscale,z,local_20->pdata);
    local_20->nps = local_20->nps + 1;
  }
  return iVar1;
}

Assistant:

int kinLsPSolve(void *kinmem, N_Vector r, N_Vector z, realtype tol, int lr)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, "kinLsPSolve",
                            &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS)  return(retval);

  /* copy the rhs into z before the psolve call */
  /* Note: z returns with the solution */
  N_VScale(ONE, r, z);

  /* note: user-supplied preconditioning with KINSOL does not
     support either the 'tol' or 'lr' inputs */
  retval = kinls_mem->psolve(kin_mem->kin_uu, kin_mem->kin_uscale,
                             kin_mem->kin_fval, kin_mem->kin_fscale,
                             z, kinls_mem->pdata);
  kinls_mem->nps++;
  return(retval);
}